

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQueue.cpp
# Opt level: O0

int test2(void)

{
  allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *paVar1;
  pointer *ppiVar2;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l_00;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l_01;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l_02;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l_03;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l_04;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  bool local_502;
  allocator<int> local_4b9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_4b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_4b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_4a8;
  undefined1 local_4a0 [8];
  vector<int,_std::allocator<int>_> firstPart;
  size_t c5Size;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_478;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_470;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_468;
  undefined1 local_460 [8];
  vector<int,_std::allocator<int>_> secondPart;
  size_t pSize;
  size_t c3Size;
  bool success;
  int local_424;
  reference_wrapper<rtb::Concurrency::Queue<int>_> local_420;
  reference_wrapper<Consumer> local_418;
  thread local_410;
  thread consumer6Thr;
  duration<long,_std::ratio<1L,_1000L>_> local_400;
  int local_3f4;
  reference_wrapper<rtb::Concurrency::Queue<int>_> local_3f0;
  reference_wrapper<Consumer> local_3e8;
  thread local_3e0;
  thread consumer5Thr;
  duration<long,_std::ratio<1L,_1000L>_> local_3d0;
  int local_3c4;
  reference_wrapper<rtb::Concurrency::Queue<int>_> local_3c0;
  reference_wrapper<Consumer> local_3b8;
  thread local_3b0;
  thread consumer4Thr;
  duration<long,_std::ratio<1L,_1000L>_> local_3a0;
  int local_394;
  reference_wrapper<rtb::Concurrency::Queue<int>_> local_390;
  reference_wrapper<Consumer> local_388;
  thread local_380;
  thread consumer3Thr;
  duration<long,_std::ratio<1L,_1000L>_> local_370;
  int local_364;
  reference_wrapper<rtb::Concurrency::Queue<int>_> local_360;
  reference_wrapper<Consumer> local_358;
  thread local_350;
  thread consumer2Thr;
  duration<long,_std::ratio<1L,_1000L>_> local_340;
  int local_334;
  reference_wrapper<rtb::Concurrency::Queue<int>_> local_330;
  reference_wrapper<Consumer> local_328;
  thread local_320;
  thread consumer1Thr;
  duration<long,_std::ratio<1L,_1000L>_> local_310;
  int local_304;
  duration<long,_std::ratio<1L,_1000L>_> local_300;
  reference_wrapper<rtb::Concurrency::Queue<int>_> local_2f8;
  reference_wrapper<Producer> local_2f0;
  thread local_2e8;
  thread prodThr;
  Consumer cons6;
  Consumer cons5;
  Consumer cons4;
  Consumer cons3;
  Consumer cons2;
  Consumer cons1;
  Producer prod;
  duration<long,_std::ratio<1L,_1000L>_> local_230;
  iterator local_228;
  size_type local_220;
  undefined1 local_218 [8];
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  unsubscribeTimeConsumer5and6;
  duration<long,_std::ratio<1L,_1000L>_> local_1f8;
  iterator local_1f0;
  size_type local_1e8;
  undefined1 local_1e0 [8];
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  subscribeTimeConsumer5and6;
  duration<long,_std::ratio<1L,_1000L>_> local_1c0;
  iterator local_1b8;
  size_type local_1b0;
  undefined1 local_1a8 [8];
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  unsubscribeTimeConsumer3and4;
  duration<long,_std::ratio<1L,_1000L>_> local_188;
  iterator local_180;
  size_type local_178;
  undefined1 local_170 [8];
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  subscribeTimeConsumer3and4;
  duration<long,_std::ratio<1L,_1000L>_> local_150;
  iterator local_148;
  size_type local_140;
  undefined1 local_138 [8];
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  unsubscribeTimeConsumer1and2;
  int local_10c;
  duration<long,_std::ratio<1L,_1000L>_> local_108;
  iterator local_100;
  size_type local_f8;
  undefined1 local_f0 [8];
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  subscribeTimeConsumer1and2;
  Queue<int> q;
  
  std::operator<<((ostream *)&std::cout,"\n ---------------- Second Test ----------------\n");
  std::operator<<((ostream *)&std::cout,"OUTPUT: Consumers 1 and 2 read messages from 1 to 100\n");
  std::operator<<((ostream *)&std::cout,"        Consumers 3 and 4 approximatively from 50 to 100\n"
                 );
  std::operator<<((ostream *)&std::cout,"        Consumers 5 and 6 approximatively from 1 to 50\n\n"
                 );
  rtb::Concurrency::Queue<int>::Queue
            ((Queue<int> *)
             &subscribeTimeConsumer1and2.
              super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_10c = 5;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_108,&local_10c);
  local_100 = &local_108;
  local_f8 = 1;
  paVar1 = (allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
           ((long)&unsubscribeTimeConsumer1and2.
                   super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::allocator(paVar1);
  __l_04._M_len = local_f8;
  __l_04._M_array = local_100;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
            *)local_f0,__l_04,paVar1);
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
             ((long)&unsubscribeTimeConsumer1and2.
                     super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  subscribeTimeConsumer3and4.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x5dc;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_150,
             (int *)((long)&subscribeTimeConsumer3and4.
                            super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_148 = &local_150;
  local_140 = 1;
  paVar1 = (allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
           ((long)&subscribeTimeConsumer3and4.
                   super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::allocator(paVar1);
  __l_03._M_len = local_140;
  __l_03._M_array = local_148;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
            *)local_138,__l_03,paVar1);
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
             ((long)&subscribeTimeConsumer3and4.
                     super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  unsubscribeTimeConsumer3and4.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 500;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_188,
             (int *)((long)&unsubscribeTimeConsumer3and4.
                            super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_180 = &local_188;
  local_178 = 1;
  paVar1 = (allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
           ((long)&unsubscribeTimeConsumer3and4.
                   super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::allocator(paVar1);
  __l_02._M_len = local_178;
  __l_02._M_array = local_180;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
            *)local_170,__l_02,paVar1);
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
             ((long)&unsubscribeTimeConsumer3and4.
                     super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  subscribeTimeConsumer5and6.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x5dc;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_1c0,
             (int *)((long)&subscribeTimeConsumer5and6.
                            super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_1b8 = &local_1c0;
  local_1b0 = 1;
  paVar1 = (allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
           ((long)&subscribeTimeConsumer5and6.
                   super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::allocator(paVar1);
  __l_01._M_len = local_1b0;
  __l_01._M_array = local_1b8;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
            *)local_1a8,__l_01,paVar1);
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
             ((long)&subscribeTimeConsumer5and6.
                     super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  unsubscribeTimeConsumer5and6.
  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_1f8,
             (int *)((long)&unsubscribeTimeConsumer5and6.
                            super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_1f0 = &local_1f8;
  local_1e8 = 1;
  paVar1 = (allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
           ((long)&unsubscribeTimeConsumer5and6.
                   super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::allocator(paVar1);
  __l_00._M_len = local_1e8;
  __l_00._M_array = local_1f0;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
            *)local_1e0,__l_00,paVar1);
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
             ((long)&unsubscribeTimeConsumer5and6.
                     super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x1fe;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_230,
             (int *)((long)&prod.producedValues.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_228 = &local_230;
  local_220 = 1;
  paVar1 = (allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
           ((long)&prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::allocator(paVar1);
  __l._M_len = local_220;
  __l._M_array = local_228;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
            *)local_218,__l,paVar1);
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)
             ((long)&prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  ppiVar2 = &cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  Producer::Producer((Producer *)ppiVar2);
  Consumer::Consumer((Consumer *)
                     &cons2.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  Consumer::Consumer((Consumer *)
                     &cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  Consumer::Consumer((Consumer *)
                     &cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  Consumer::Consumer((Consumer *)
                     &cons5.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  Consumer::Consumer((Consumer *)
                     &cons6.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  Consumer::Consumer((Consumer *)&prodThr);
  local_2f0 = std::ref<Producer>((Producer *)ppiVar2);
  local_2f8 = std::ref<rtb::Concurrency::Queue<int>>
                        ((Queue<int> *)
                         &subscribeTimeConsumer1and2.
                          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_304 = 10;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_300,&local_304);
  consumer1Thr._M_id._M_thread._4_4_ = 10;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_310,
             (int *)((long)&consumer1Thr._M_id._M_thread + 4));
  consumer1Thr._M_id._M_thread._0_4_ = 100;
  std::thread::
  thread<std::reference_wrapper<Producer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>,int,void>
            (&local_2e8,&local_2f0,&local_2f8,&local_300,&local_310,(int *)&consumer1Thr);
  local_328 = std::ref<Consumer>((Consumer *)
                                 &cons2.consumedValues.super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_330 = std::ref<rtb::Concurrency::Queue<int>>
                        ((Queue<int> *)
                         &subscribeTimeConsumer1and2.
                          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_334 = 1;
  consumer2Thr._M_id._M_thread._4_4_ = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_340,
             (int *)((long)&consumer2Thr._M_id._M_thread + 4));
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&local_320,&local_328,&local_330,&local_334,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_f0,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_138,&local_340);
  local_358 = std::ref<Consumer>((Consumer *)
                                 &cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_360 = std::ref<rtb::Concurrency::Queue<int>>
                        ((Queue<int> *)
                         &subscribeTimeConsumer1and2.
                          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_364 = 2;
  consumer3Thr._M_id._M_thread._4_4_ = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_370,
             (int *)((long)&consumer3Thr._M_id._M_thread + 4));
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&local_350,&local_358,&local_360,&local_364,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_f0,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_138,&local_370);
  local_388 = std::ref<Consumer>((Consumer *)
                                 &cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_390 = std::ref<rtb::Concurrency::Queue<int>>
                        ((Queue<int> *)
                         &subscribeTimeConsumer1and2.
                          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_394 = 3;
  consumer4Thr._M_id._M_thread._4_4_ = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_3a0,
             (int *)((long)&consumer4Thr._M_id._M_thread + 4));
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&local_380,&local_388,&local_390,&local_394,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_170,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_1a8,&local_3a0);
  local_3b8 = std::ref<Consumer>((Consumer *)
                                 &cons5.consumedValues.super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_3c0 = std::ref<rtb::Concurrency::Queue<int>>
                        ((Queue<int> *)
                         &subscribeTimeConsumer1and2.
                          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_3c4 = 4;
  consumer5Thr._M_id._M_thread._4_4_ = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_3d0,
             (int *)((long)&consumer5Thr._M_id._M_thread + 4));
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&local_3b0,&local_3b8,&local_3c0,&local_3c4,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_170,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_1a8,&local_3d0);
  local_3e8 = std::ref<Consumer>((Consumer *)
                                 &cons6.consumedValues.super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_3f0 = std::ref<rtb::Concurrency::Queue<int>>
                        ((Queue<int> *)
                         &subscribeTimeConsumer1and2.
                          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_3f4 = 5;
  consumer6Thr._M_id._M_thread._4_4_ = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_400,
             (int *)((long)&consumer6Thr._M_id._M_thread + 4));
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&local_3e0,&local_3e8,&local_3f0,&local_3f4,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_1e0,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_218,&local_400);
  local_418 = std::ref<Consumer>((Consumer *)&prodThr);
  local_420 = std::ref<rtb::Concurrency::Queue<int>>
                        ((Queue<int> *)
                         &subscribeTimeConsumer1and2.
                          super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_424 = 6;
  c3Size._4_4_ = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&stack0xfffffffffffffbd0,
             (int *)((long)&c3Size + 4));
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&local_410,&local_418,&local_420,&local_424,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_1e0,
             (vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              *)local_218,(duration<long,_std::ratio<1L,_1000L>_> *)&stack0xfffffffffffffbd0);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  c3Size._3_1_ = 1;
  bVar3 = std::operator==((vector<int,_std::allocator<int>_> *)
                          &cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<int,_std::allocator<int>_> *)
                          &cons2.consumedValues.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_502 = false;
  if (bVar3) {
    local_502 = std::operator==((vector<int,_std::allocator<int>_> *)
                                &cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (vector<int,_std::allocator<int>_> *)
                                &cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  c3Size._3_1_ = local_502;
  sVar5 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)
                     &cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  c3Size._3_1_ = c3Size._3_1_ & 0x2d < sVar5;
  ppiVar2 = &cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  secondPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)ppiVar2);
  local_470._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)ppiVar2);
  local_468 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator+(&local_470,
                        (long)secondPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage - sVar5);
  local_478._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)ppiVar2);
  std::allocator<int>::allocator((allocator<int> *)((long)&c5Size + 7));
  std::vector<int,std::allocator<int>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)local_460,local_468,local_478,
             (allocator<int> *)((long)&c5Size + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&c5Size + 7));
  bVar3 = std::operator==((vector<int,_std::allocator<int>_> *)local_460,
                          (vector<int,_std::allocator<int>_> *)
                          &cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  c3Size._3_1_ = bVar3 & c3Size._3_1_;
  firstPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)
                           &cons6.consumedValues.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
  c3Size._3_1_ = c3Size._3_1_ &
                 firstPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage < (pointer)0x37;
  ppiVar2 = &cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_4a8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)ppiVar2);
  local_4b8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)ppiVar2);
  local_4b0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator+(&local_4b8,
                        (difference_type)
                        firstPart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  std::allocator<int>::allocator(&local_4b9);
  std::vector<int,std::allocator<int>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)local_4a0,local_4a8,local_4b0,&local_4b9);
  std::allocator<int>::~allocator(&local_4b9);
  bVar3 = std::operator==((vector<int,_std::allocator<int>_> *)local_4a0,
                          (vector<int,_std::allocator<int>_> *)
                          &cons6.consumedValues.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  c3Size._3_1_ = (c3Size._3_1_ & 1 & bVar3) != 0;
  uVar4 = (uint)c3Size._3_1_;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_4a0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_460);
  std::thread::~thread(&local_410);
  std::thread::~thread(&local_3e0);
  std::thread::~thread(&local_3b0);
  std::thread::~thread(&local_380);
  std::thread::~thread(&local_350);
  std::thread::~thread(&local_320);
  std::thread::~thread(&local_2e8);
  Consumer::~Consumer((Consumer *)&prodThr);
  Consumer::~Consumer((Consumer *)
                      &cons6.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  Consumer::~Consumer((Consumer *)
                      &cons5.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  Consumer::~Consumer((Consumer *)
                      &cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  Consumer::~Consumer((Consumer *)
                      &cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  Consumer::~Consumer((Consumer *)
                      &cons2.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  Producer::~Producer((Producer *)
                      &cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
             *)local_218);
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
             *)local_1e0);
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
             *)local_1a8);
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
             *)local_170);
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
             *)local_138);
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
             *)local_f0);
  rtb::Concurrency::Queue<int>::~Queue
            ((Queue<int> *)
             &subscribeTimeConsumer1and2.
              super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return uVar4;
}

Assistant:

int test2() {
    // SECOND TEST
    // Producer start first (at 10) and send 100 msg with a period of 10
    // Consumer 1 and 2 subscribe before (at 5),
    // Consumer 3 and 4 subscribe after (at 500) and read half of the messages
    // Consumer 5 and 6 subscribe before (at 5) andn leave in the middle
    // OUTPUT: Consumers 1 and 2 100 messages
    //         Consumers 3 and 4 roughly the last half of the messages
    //         Consumers 5 and 6 roughly the first half of the messages

    std::cout << "\n ---------------- Second Test ----------------\n";
    std::cout << "OUTPUT: Consumers 1 and 2 read messages from 1 to 100\n";
    std::cout << "        Consumers 3 and 4 approximatively from 50 to 100\n";
    std::cout << "        Consumers 5 and 6 approximatively from 1 to 50\n\n";

    Queue<int> q;

    std::vector<TimeT> subscribeTimeConsumer1and2 = { TimeT{ 5 } };
    std::vector<TimeT> unsubscribeTimeConsumer1and2 = { TimeT{ 1500 } };
    std::vector<TimeT> subscribeTimeConsumer3and4 = { TimeT{ 500 } };
    std::vector<TimeT> unsubscribeTimeConsumer3and4 = { TimeT{ 1500 } };
    std::vector<TimeT> subscribeTimeConsumer5and6 = { TimeT{ 5 } };
    std::vector<TimeT> unsubscribeTimeConsumer5and6 = { TimeT{ 510 } };

    Producer prod;
    Consumer cons1, cons2, cons3, cons4, cons5, cons6;

    // producer thread
    std::thread prodThr(ref(prod), ref(q), TimeT{ 10 }, TimeT{ 10 }, 100);

    // consumer threads
    std::thread consumer1Thr(ref(cons1),
        ref(q),
        1,
        subscribeTimeConsumer1and2,
        unsubscribeTimeConsumer1and2,
        TimeT{ 0 });

    std::thread consumer2Thr(ref(cons2),
        ref(q),
        2,
        subscribeTimeConsumer1and2,
        unsubscribeTimeConsumer1and2,
        TimeT{ 0 });
    std::thread consumer3Thr(ref(cons3),
        ref(q),
        3,
        subscribeTimeConsumer3and4,
        unsubscribeTimeConsumer3and4,
        TimeT{ 0 });
    std::thread consumer4Thr(ref(cons4),
        ref(q),
        4,
        subscribeTimeConsumer3and4,
        unsubscribeTimeConsumer3and4,
        TimeT{ 0 });
    std::thread consumer5Thr(ref(cons5),
        ref(q),
        5,
        subscribeTimeConsumer5and6,
        unsubscribeTimeConsumer5and6,
        TimeT{ 0 });
    std::thread consumer6Thr(ref(cons6),
        ref(q),
        6,
        subscribeTimeConsumer5and6,
        unsubscribeTimeConsumer5and6,
        TimeT{ 0 });

    prodThr.join();
    consumer1Thr.join();
    consumer2Thr.join();
    consumer3Thr.join();
    consumer4Thr.join();
    consumer5Thr.join();
    consumer6Thr.join();

    bool success = true;
    //
    success = (prod.producedValues == cons1.consumedValues)
              && (prod.producedValues == cons2.consumedValues);

    size_t c3Size = cons3.consumedValues.size();
    success &= (c3Size > 45);
    size_t pSize = prod.producedValues.size();
    std::vector<int> secondPart(
        prod.producedValues.begin() + (pSize - c3Size), prod.producedValues.end());
    success &= (secondPart == cons3.consumedValues);

    size_t c5Size = cons5.consumedValues.size();
    success &= (c5Size < 55);
    std::vector<int> firstPart(prod.producedValues.begin(), prod.producedValues.begin() + c5Size);
    success &= (firstPart == cons5.consumedValues);

    return success;
}